

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refresh.c
# Opt level: O3

void re_putliteral(EditLine *el,wchar_t *begin,wchar_t *end)

{
  wchar_t wVar1;
  wint_t **ppwVar2;
  wint_t wVar3;
  wchar_t wVar4;
  uint uVar5;
  undefined8 in_RAX;
  long lVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  wchar_t w;
  wchar_t local_14;
  
  local_14 = (wchar_t)((ulong)in_RAX >> 0x20);
  wVar1 = (el->el_terminal).t_size.h;
  wVar3 = literal_add(el,begin,end,&local_14);
  if ((wVar3 != 0) && (L'\0' < local_14)) {
    ppwVar2 = el->el_vdisplay;
    ppwVar2[(el->el_refresh).r_cursor.v][(el->el_refresh).r_cursor.h] = wVar3;
    wVar7 = (el->el_refresh).r_cursor.h;
    wVar8 = wVar1 - wVar7;
    wVar4 = wVar8;
    if (local_14 < wVar8) {
      wVar4 = local_14;
    }
    if (L'\x01' < wVar4) {
      uVar5 = wVar4 + L'\x01';
      lVar6 = (long)wVar8;
      if ((long)local_14 < (long)wVar8) {
        lVar6 = (long)local_14;
      }
      do {
        ppwVar2[(el->el_refresh).r_cursor.v][(long)(el->el_refresh).r_cursor.h + lVar6 + -1] =
             0xffffffff;
        uVar5 = uVar5 - 1;
        lVar6 = lVar6 + -1;
      } while (2 < uVar5);
      wVar7 = (el->el_refresh).r_cursor.h;
    }
    (el->el_refresh).r_cursor.h = wVar7 + local_14;
    if (wVar1 <= wVar7 + local_14) {
      ppwVar2[(el->el_refresh).r_cursor.v][wVar1] = 0;
      re_nextline(el);
    }
  }
  return;
}

Assistant:

libedit_private void
re_putliteral(EditLine *el, const wchar_t *begin, const wchar_t *end)
{
	coord_t *cur = &el->el_refresh.r_cursor;
	wint_t c;
	int sizeh = el->el_terminal.t_size.h;
	int i, w;

	c = literal_add(el, begin, end, &w);
	if (c == 0 || w <= 0)
		return;
	el->el_vdisplay[cur->v][cur->h] = c;

	i = w;
	if (i > sizeh - cur->h)		/* avoid overflow */
		i = sizeh - cur->h;
	while (--i > 0)
		el->el_vdisplay[cur->v][cur->h + i] = MB_FILL_CHAR;

	cur->h += w;
	if (cur->h >= sizeh) {
		/* assure end of line */
		el->el_vdisplay[cur->v][sizeh] = '\0';
		re_nextline(el);
	}
}